

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMask::~ChLinkMask(ChLinkMask *this)

{
  ChConstraintTwoBodies *pCVar1;
  int i;
  long lVar2;
  
  this->_vptr_ChLinkMask = (_func_int **)&PTR__ChLinkMask_011616b8;
  for (lVar2 = 0; lVar2 < this->nconstr; lVar2 = lVar2 + 1) {
    pCVar1 = (this->constraints).
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar2];
    if (pCVar1 != (ChConstraintTwoBodies *)0x0) {
      (**(code **)((long)(pCVar1->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8))
                ();
    }
  }
  std::
  _Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
  ~_Vector_base(&(this->constraints).
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               );
  return;
}

Assistant:

ChLinkMask::~ChLinkMask() {
    for (int i = 0; i < nconstr; i++) {
        if (constraints[i]) {
            delete constraints[i];
        }
    }
}